

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void anon_unknown.dwarf_115aec::setClipboardText(void *param_1,char *text)

{
  size_t sVar1;
  char *in_RCX;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_30
  ;
  
  sVar1 = strlen(text);
  sf::String::fromUtf8<char_const*>((String *)&local_30,(String *)text,text + sVar1,in_RCX);
  sf::Clipboard::setString((String *)&local_30);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_30);
  return;
}

Assistant:

void setClipboardText(void* /*userData*/, const char* text) {
    sf::Clipboard::setString(sf::String::fromUtf8(text, text + std::strlen(text)));
}